

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetUserArray
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int pos;
  int iVar1;
  _func_int **pp_Var2;
  bool bVar3;
  PField *pPVar4;
  DObject *this;
  char *pcVar5;
  FName local_24;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003e9521;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (DObject *)0x0) {
        bVar3 = DObject::IsKindOf(this,DObject::RegistrationInfo.MyClass);
        if (!bVar3) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))";
          goto LAB_003e9521;
        }
        goto LAB_003e9480;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_003e9511;
    this = (DObject *)0x0;
LAB_003e9480:
    if (numparam == 1) {
      pcVar5 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if ((uint)numparam < 3) {
          pcVar5 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            if (numparam == 3) {
              pcVar5 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\0') {
                pos = param[2].field_0.i;
                iVar1 = param[3].field_0.i;
                pPVar4 = GetArrayVar(this,&local_24,pos);
                if (pPVar4 != (PField *)0x0) {
                  pp_Var2 = pPVar4->Type[1].super_PTypeBase.super_DObject._vptr_DObject;
                  (**(code **)(*pp_Var2 + 0x78))
                            (pp_Var2,(long)&this->_vptr_DObject +
                                     (ulong)(uint)(pos * *(int *)((long)&pPVar4->Type[1].
                                                                         super_PTypeBase.
                                                                         super_DObject.Class + 4)) +
                                     pPVar4->Offset,iVar1);
                }
                return 0;
              }
              pcVar5 = "param[paramnum].Type == REGT_INT";
            }
            __assert_fail(pcVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x133e,
                          "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar5 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x133d,
                      "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar5 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133c,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e9511:
  pcVar5 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003e9521:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x133b,
                "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserArray)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_INT	(pos);
	PARAM_INT	(value);

	// Set the value of the specified user array at index pos.
	PField *var = GetArrayVar(self, varname, pos);
	if (var != nullptr)
	{
		PArray *arraytype = static_cast<PArray *>(var->Type);
		arraytype->ElementType->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset + arraytype->ElementSize * pos, value);
	}
	return 0;
}